

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O1

IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>_>_>_>
* __thiscall
Lib::
iterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>>>>
          (IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>_>_>_>
           *__return_storage_ptr__,Lib *this,
          CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>_>_>
          *i)

{
  int *piVar1;
  Lib LVar2;
  IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
  *pIVar3;
  IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
  *pIVar4;
  
  LVar2 = *this;
  pIVar3 = *(IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
             **)(this + 8);
  if (pIVar3 != (IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
                 *)0x0) {
    pIVar3->_refCnt = pIVar3->_refCnt + 1;
  }
  pIVar4 = *(IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
             **)(this + 0x10);
  if (pIVar4 != (IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
                 *)0x0) {
    pIVar4->_refCnt = pIVar4->_refCnt + 1;
  }
  (__return_storage_ptr__->_iter)._first = (bool)LVar2;
  (__return_storage_ptr__->_iter)._it1._core = pIVar3;
  if (pIVar3 != (IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
                 *)0x0) {
    pIVar3->_refCnt = pIVar3->_refCnt + 1;
  }
  (__return_storage_ptr__->_iter)._it2._iter._core = pIVar4;
  if ((pIVar4 != (IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
                  *)0x0) && (pIVar4->_refCnt == 0)) {
    (*pIVar4->_vptr_IteratorCore[1])();
  }
  if (pIVar3 != (IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
                 *)0x0) {
    piVar1 = &pIVar3->_refCnt;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*pIVar3->_vptr_IteratorCore[1])(pIVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IterTraits<Iter> iterTraits(Iter i) { return IterTraits<Iter>(std::move(i)); }